

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

_Bool cancel_all_pending_twin_operations(void *item,void *match_context,_Bool *continue_processing)

{
  LOGGER_LOG p_Var1;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  
  if (continue_processing != (_Bool *)0x0 && item != (void *)0x0) {
    if ((*item == 1) && (*(code **)((long)item + 0x18) != (code *)0x0)) {
      (**(code **)((long)item + 0x18))(2,5,0,*(undefined8 *)((long)item + 0x20));
    }
    free(*(void **)((long)item + 0x10));
    free(item);
    *continue_processing = true;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"cancel_all_pending_twin_operations",0x4da,1,
                "Invalid argument (item=%p, continue_processing=%p)",item,continue_processing);
    }
  }
  return continue_processing != (_Bool *)0x0 && item != (void *)0x0;
}

Assistant:

static bool cancel_all_pending_twin_operations(const void* item, const void* match_context, bool* continue_processing)
{
    bool result;

    if (item == NULL || continue_processing == NULL)
    {
        LogError("Invalid argument (item=%p, continue_processing=%p)", item, continue_processing);
        result = false;
    }
    else
    {
        TWIN_OPERATION_CONTEXT* twin_op_ctx = (TWIN_OPERATION_CONTEXT*)item;
        (void)match_context;

        if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
        {
            if (twin_op_ctx->cb.reported_properties.callback != NULL)
            {
                twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_CANCELLED, TWIN_REPORT_STATE_REASON_MESSENGER_DESTROYED, 0, twin_op_ctx->cb.reported_properties.context);
            }
        }

        destroy_twin_operation_context(twin_op_ctx);

        *continue_processing = true;
        result = true;
    }

    return result;
}